

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  Pring *pPVar8;
  int *piVar9;
  int *piVar10;
  pointer pnVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int32_t iVar19;
  int *piVar20;
  Pring *pPVar21;
  Pring *pPVar22;
  Pring *pPVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int *piVar28;
  long lVar29;
  int iVar30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  pPVar21 = (this->temp).pivot_colNZ;
  pPVar23 = pPVar21[1].prev;
  pPVar22 = pPVar21 + 1;
  if (pPVar23 != pPVar22) {
    do {
      iVar3 = pPVar23->idx;
      piVar5 = (this->u).col.len;
      iVar4 = piVar5[iVar3];
      piVar5[iVar3] = iVar4 + -1;
      piVar6 = (this->u).col.idx;
      piVar7 = (this->u).col.start;
      iVar4 = piVar6[(long)piVar7[iVar3] + -1 + (long)iVar4];
      pPVar22 = (this->temp).pivot_row;
      pPVar8 = pPVar22[iVar4].next;
      pPVar8->prev = pPVar22[iVar4].prev;
      (pPVar22[iVar4].prev)->next = pPVar8;
      piVar9 = (this->u).row.len;
      iVar26 = piVar9[iVar4];
      piVar9[iVar4] = iVar26 + -1;
      piVar9 = (this->u).row.idx;
      lVar29 = (long)(this->u).row.start[iVar4] + -1 + (long)iVar26;
      iVar26 = piVar9[lVar29];
      iVar27 = (int)lVar29;
      iVar25 = iVar27;
      if (iVar26 != iVar3) {
        lVar29 = (long)iVar27;
        piVar10 = (this->temp).s_cact;
        pPVar22 = (this->temp).pivot_col;
        do {
          iVar25 = piVar7[iVar26];
          iVar24 = piVar5[iVar26];
          iVar30 = piVar10[iVar26];
          piVar10[iVar26] = iVar30 + -1;
          iVar30 = (iVar25 + iVar24) - iVar30;
          piVar20 = piVar6 + iVar30;
          do {
            piVar28 = piVar20;
            piVar20 = piVar28 + 1;
          } while (*piVar28 != iVar4);
          *piVar28 = piVar6[iVar30];
          piVar6[iVar30] = iVar4;
          iVar25 = piVar10[iVar26];
          pPVar8 = pPVar22[iVar26].next;
          pPVar8->prev = pPVar22[iVar26].prev;
          (pPVar22[iVar26].prev)->next = pPVar8;
          pPVar8 = pPVar21[iVar25].next;
          pPVar22[iVar26].next = pPVar8;
          pPVar8->prev = pPVar22 + iVar26;
          pPVar22[iVar26].prev = pPVar21 + iVar25;
          pPVar21[iVar25].next = pPVar22 + iVar26;
          iVar26 = piVar9[lVar29 + -1];
          lVar29 = lVar29 + -1;
        } while (iVar26 != iVar3);
        iVar25 = (int)lVar29;
      }
      iVar26 = (this->temp).stage;
      (this->temp).stage = iVar26 + 1;
      pnVar11 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_88.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)pnVar11[lVar29].m_backend.data._M_elems;
      local_88.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)pnVar11[lVar29].m_backend.data._M_elems + 8);
      puVar1 = (uint *)((long)pnVar11[lVar29].m_backend.data._M_elems + 0x10);
      local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar11[lVar29].m_backend.data._M_elems + 0x20);
      local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar11[lVar29].m_backend.data._M_elems + 0x30);
      local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.m_backend.exp = pnVar11[lVar29].m_backend.exp;
      local_88.m_backend.neg = pnVar11[lVar29].m_backend.neg;
      local_88.m_backend.fpclass = pnVar11[lVar29].m_backend.fpclass;
      local_88.m_backend.prec_elem = pnVar11[lVar29].m_backend.prec_elem;
      setPivot(this,iVar26,iVar3,iVar4,&local_88);
      piVar5 = (this->u).row.idx;
      piVar5[lVar29] = piVar5[iVar27];
      pnVar11 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)pnVar11[iVar27].m_backend.data._M_elems;
      uVar13 = *(undefined8 *)((long)pnVar11[iVar27].m_backend.data._M_elems + 8);
      puVar1 = (uint *)((long)pnVar11[iVar27].m_backend.data._M_elems + 0x10);
      uVar14 = *(undefined8 *)puVar1;
      uVar15 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar11[iVar27].m_backend.data._M_elems + 0x20);
      uVar16 = *(undefined8 *)puVar1;
      uVar17 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar11[iVar27].m_backend.data._M_elems + 0x30);
      uVar18 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)pnVar11[lVar29].m_backend.data._M_elems + 0x30);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar18;
      puVar1 = (uint *)((long)pnVar11[lVar29].m_backend.data._M_elems + 0x20);
      *(undefined8 *)puVar1 = uVar16;
      *(undefined8 *)(puVar1 + 2) = uVar17;
      puVar1 = (uint *)((long)pnVar11[lVar29].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = uVar14;
      *(undefined8 *)(puVar1 + 2) = uVar15;
      *(undefined8 *)pnVar11[lVar29].m_backend.data._M_elems = uVar12;
      *(undefined8 *)((long)pnVar11[lVar29].m_backend.data._M_elems + 8) = uVar13;
      pnVar11[lVar29].m_backend.exp = pnVar11[iVar27].m_backend.exp;
      pnVar11[lVar29].m_backend.neg = pnVar11[iVar27].m_backend.neg;
      iVar19 = pnVar11[iVar27].m_backend.prec_elem;
      pnVar11[lVar29].m_backend.fpclass = pnVar11[iVar27].m_backend.fpclass;
      pnVar11[lVar29].m_backend.prec_elem = iVar19;
      iVar3 = (this->u).row.start[iVar4];
      if (iVar3 < iVar25) {
        piVar5 = (this->u).row.idx;
        piVar6 = (this->u).col.idx;
        piVar7 = (this->u).col.len;
        piVar9 = (this->u).col.start;
        piVar10 = (this->temp).s_cact;
        pPVar22 = (this->temp).pivot_col;
        pPVar21 = (this->temp).pivot_colNZ;
        lVar29 = (long)iVar25;
        do {
          iVar26 = piVar5[lVar29 + -1];
          lVar29 = lVar29 + -1;
          iVar25 = piVar9[iVar26];
          iVar27 = piVar7[iVar26];
          iVar24 = piVar10[iVar26];
          piVar10[iVar26] = iVar24 + -1;
          iVar24 = (iVar25 + iVar27) - iVar24;
          piVar20 = piVar6 + iVar24;
          do {
            piVar28 = piVar20;
            piVar20 = piVar28 + 1;
          } while (*piVar28 != iVar4);
          *piVar28 = piVar6[iVar24];
          piVar6[iVar24] = iVar4;
          iVar25 = piVar10[iVar26];
          pPVar8 = pPVar22[iVar26].next;
          pPVar8->prev = pPVar22[iVar26].prev;
          (pPVar22[iVar26].prev)->next = pPVar8;
          pPVar8 = pPVar21[iVar25].next;
          pPVar22[iVar26].next = pPVar8;
          pPVar8->prev = pPVar22 + iVar26;
          pPVar22[iVar26].prev = pPVar21 + iVar25;
          pPVar21[iVar25].next = pPVar22 + iVar26;
        } while (iVar3 < lVar29);
      }
      pPVar23 = pPVar23->prev;
      pPVar21 = (this->temp).pivot_colNZ;
      pPVar22 = pPVar21 + 1;
    } while (pPVar23 != pPVar22);
  }
  pPVar21[1].next = pPVar21 + 1;
  pPVar21[1].prev = pPVar22;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}